

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_odd_first(void)

{
  array<int,_5UL> storage;
  undefined4 local_64;
  int *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined1 local_44 [12];
  undefined4 *local_38;
  
  local_58 = 0xb;
  uStack_54 = 0x16;
  uStack_50 = 0x21;
  uStack_4c = 0x2c;
  local_48 = 0x37;
  local_64 = 10;
  local_60 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_58,local_44,&local_64);
  local_38 = &local_58;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3fe,"void lower_bound_sorted_suite::find_odd_first()",&local_60,&local_38);
  local_64 = 0xb;
  local_60 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_58,local_44,&local_64);
  local_38 = &local_58;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x400,"void lower_bound_sorted_suite::find_odd_first()",&local_60,&local_38);
  local_64 = 0xc;
  local_60 = vista::lower_bound_sorted<int*,int,std::less<int>>(&local_58,local_44,&local_64);
  local_38 = &uStack_54;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12)",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x402,"void lower_bound_sorted_suite::find_odd_first()",&local_60,&local_38);
  return;
}

Assistant:

void find_odd_first()
{
    std::array<int, 5> storage = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12),
                  std::next(storage.begin(), 1));
}